

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O1

bool btPolyhedralContactClipping::findSeparatingAxis
               (btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
               btTransform *transB,btVector3 *sep,Result *resultOut)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btFace *pbVar3;
  btVector3 *pbVar4;
  undefined1 auVar5 [16];
  btVector3 bVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float local_1bc;
  btVector3 local_1b8;
  btScalar d;
  btConvexPolyhedron *local_1a0;
  btVector3 DeltaC2;
  uint local_17c;
  uint local_178;
  float local_158;
  btVector3 wA;
  undefined8 local_f8;
  float local_e8;
  float local_c8 [4];
  btVector3 wB;
  float local_a8 [8];
  float local_88;
  undefined8 local_78;
  
  gActualSATPairTests = gActualSATPairTests + 1;
  fVar23 = (hullA->m_localCenter).m_floats[0];
  fVar22 = (hullA->m_localCenter).m_floats[1];
  fVar25 = (hullA->m_localCenter).m_floats[2];
  fVar28 = (hullB->m_localCenter).m_floats[0];
  fVar20 = (hullB->m_localCenter).m_floats[1];
  fVar29 = (hullB->m_localCenter).m_floats[2];
  uVar1 = *(undefined8 *)(transA->m_origin).m_floats;
  uVar2 = *(undefined8 *)(transB->m_origin).m_floats;
  fVar21 = ((float)uVar1 +
           fVar25 * (transA->m_basis).m_el[0].m_floats[2] +
           (transA->m_basis).m_el[0].m_floats[0] * fVar23 +
           (transA->m_basis).m_el[0].m_floats[1] * fVar22) -
           ((float)uVar2 +
           fVar29 * (transB->m_basis).m_el[0].m_floats[2] +
           (transB->m_basis).m_el[0].m_floats[0] * fVar28 +
           (transB->m_basis).m_el[0].m_floats[1] * fVar20);
  fVar24 = ((float)((ulong)uVar1 >> 0x20) +
           fVar25 * (transA->m_basis).m_el[1].m_floats[2] +
           (transA->m_basis).m_el[1].m_floats[0] * fVar23 +
           (transA->m_basis).m_el[1].m_floats[1] * fVar22) -
           ((float)((ulong)uVar2 >> 0x20) +
           fVar29 * (transB->m_basis).m_el[1].m_floats[2] +
           (transB->m_basis).m_el[1].m_floats[0] * fVar28 +
           (transB->m_basis).m_el[1].m_floats[1] * fVar20);
  fVar28 = ((transA->m_origin).m_floats[2] +
           (transA->m_basis).m_el[2].m_floats[2] * fVar25 +
           (transA->m_basis).m_el[2].m_floats[0] * fVar23 +
           (transA->m_basis).m_el[2].m_floats[1] * fVar22) -
           ((transB->m_origin).m_floats[2] +
           (transB->m_basis).m_el[2].m_floats[2] * fVar29 +
           (transB->m_basis).m_el[2].m_floats[0] * fVar28 +
           (transB->m_basis).m_el[2].m_floats[1] * fVar20);
  DeltaC2.m_floats[1] = fVar24;
  DeltaC2.m_floats[0] = fVar21;
  DeltaC2.m_floats[2] = fVar28;
  DeltaC2.m_floats[3] = 0.0;
  uVar13 = (ulong)(hullA->m_faces).m_size;
  bVar18 = 0 < (long)uVar13;
  local_1a0 = hullA;
  if ((long)uVar13 < 1) {
    local_1bc = 3.4028235e+38;
  }
  else {
    local_1bc = 3.4028235e+38;
    lVar15 = 0x28;
    uVar16 = 1;
    do {
      pbVar3 = (local_1a0->m_faces).m_data;
      fVar20 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x28);
      fVar29 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x24);
      fVar23 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x20);
      fVar22 = fVar23 * (transA->m_basis).m_el[0].m_floats[2] +
               fVar20 * (transA->m_basis).m_el[0].m_floats[0] +
               (transA->m_basis).m_el[0].m_floats[1] * fVar29;
      fVar25 = fVar23 * (transA->m_basis).m_el[1].m_floats[2] +
               fVar20 * (transA->m_basis).m_el[1].m_floats[0] +
               (transA->m_basis).m_el[1].m_floats[1] * fVar29;
      fVar20 = fVar23 * (transA->m_basis).m_el[2].m_floats[2] +
               fVar20 * (transA->m_basis).m_el[2].m_floats[0] +
               fVar29 * (transA->m_basis).m_el[2].m_floats[1];
      local_1b8.m_floats[1] = fVar25;
      local_1b8.m_floats[0] = fVar22;
      local_1b8.m_floats[2] = fVar20;
      if (fVar28 * fVar20 + fVar21 * fVar22 + fVar25 * fVar24 < 0.0) {
        local_1b8.m_floats[2] = -fVar20;
        local_1b8.m_floats._0_8_ = CONCAT44(fVar25,fVar22) ^ 0x8000000080000000;
      }
      local_1b8.m_floats[3] = 0.0;
      local_1b8.m_floats[0] = (btScalar)local_1b8.m_floats[0];
      local_1b8.m_floats[1] = (btScalar)local_1b8.m_floats[1];
      local_1b8.m_floats[2] = (btScalar)local_1b8.m_floats[2];
      gExpectedNbTests = gExpectedNbTests + 1;
      if (gUseInternalObject == true) {
        bVar10 = TestInternalObjects(transA,transB,&DeltaC2,&local_1b8,local_1a0,hullB,local_1bc);
        bVar19 = false;
        if (bVar10) goto LAB_00186208;
      }
      else {
LAB_00186208:
        gActualNbTests = gActualNbTests + 1;
        bVar10 = TestSepAxis(local_1a0,hullB,transA,transB,&local_1b8,&d,&wA,&wB);
        bVar19 = true;
        if ((bVar10) && (bVar19 = false, d < local_1bc)) {
          *(undefined8 *)sep->m_floats = local_1b8.m_floats._0_8_;
          *(undefined8 *)(sep->m_floats + 2) = local_1b8.m_floats._8_8_;
          local_1bc = d;
        }
      }
      if (bVar19) break;
      bVar18 = uVar16 < uVar13;
      lVar15 = lVar15 + 0x30;
      bVar19 = uVar16 != uVar13;
      uVar16 = uVar16 + 1;
    } while (bVar19);
  }
  if (!bVar18) {
    uVar13 = (ulong)(hullB->m_faces).m_size;
    bVar18 = 0 < (long)uVar13;
    if (0 < (long)uVar13) {
      bVar7 = DeltaC2.m_floats[0];
      bVar8 = DeltaC2.m_floats[1];
      bVar9 = DeltaC2.m_floats[2];
      lVar15 = 0x28;
      uVar16 = 1;
      do {
        pbVar3 = (hullB->m_faces).m_data;
        fVar28 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x28);
        fVar20 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x24);
        fVar29 = *(float *)((long)pbVar3->m_plane + lVar15 + -0x20);
        fVar23 = fVar29 * (transB->m_basis).m_el[0].m_floats[2] +
                 fVar28 * (transB->m_basis).m_el[0].m_floats[0] +
                 (transB->m_basis).m_el[0].m_floats[1] * fVar20;
        fVar22 = fVar29 * (transB->m_basis).m_el[1].m_floats[2] +
                 fVar28 * (transB->m_basis).m_el[1].m_floats[0] +
                 (transB->m_basis).m_el[1].m_floats[1] * fVar20;
        fVar28 = fVar29 * (transB->m_basis).m_el[2].m_floats[2] +
                 fVar28 * (transB->m_basis).m_el[2].m_floats[0] +
                 fVar20 * (transB->m_basis).m_el[2].m_floats[1];
        local_1b8.m_floats[1] = fVar22;
        local_1b8.m_floats[0] = fVar23;
        local_1b8.m_floats[2] = fVar28;
        if (bVar9 * fVar28 + bVar7 * fVar23 + fVar22 * bVar8 < 0.0) {
          local_1b8.m_floats[2] = -fVar28;
          local_1b8.m_floats._0_8_ = CONCAT44(fVar22,fVar23) ^ 0x8000000080000000;
        }
        local_1b8.m_floats[3] = 0.0;
        local_1b8.m_floats[0] = (btScalar)local_1b8.m_floats[0];
        local_1b8.m_floats[1] = (btScalar)local_1b8.m_floats[1];
        local_1b8.m_floats[2] = (btScalar)local_1b8.m_floats[2];
        gExpectedNbTests = gExpectedNbTests + 1;
        if (gUseInternalObject == true) {
          bVar19 = TestInternalObjects(transA,transB,&DeltaC2,&local_1b8,local_1a0,hullB,local_1bc);
          iVar12 = 7;
          if (bVar19) goto LAB_00186445;
        }
        else {
LAB_00186445:
          gActualNbTests = gActualNbTests + 1;
          bVar19 = TestSepAxis(local_1a0,hullB,transA,transB,&local_1b8,&d,&wA,&wB);
          iVar12 = 1;
          if ((bVar19) && (iVar12 = 0, d < local_1bc)) {
            *(undefined8 *)sep->m_floats = local_1b8.m_floats._0_8_;
            *(undefined8 *)(sep->m_floats + 2) = local_1b8.m_floats._8_8_;
            local_1bc = d;
          }
        }
        if ((iVar12 != 7) && (iVar12 != 0)) break;
        bVar18 = uVar16 < uVar13;
        lVar15 = lVar15 + 0x30;
        bVar19 = uVar16 != uVar13;
        uVar16 = uVar16 + 1;
      } while (bVar19);
    }
    if (!bVar18) {
      iVar12 = (local_1a0->m_uniqueEdges).m_size;
      bVar18 = iVar12 < 1;
      if (iVar12 < 1) {
        bVar19 = false;
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        fVar20 = 0.0;
        fVar28 = 0.0;
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
      }
      else {
        bVar7 = DeltaC2.m_floats[0];
        bVar8 = DeltaC2.m_floats[1];
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_178 = 0xffffffff;
        bVar9 = DeltaC2.m_floats[2];
        lVar15 = 0;
        local_17c = 0xffffffff;
        fVar28 = 0.0;
        fVar20 = 0.0;
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        do {
          cVar11 = '\v';
          if (0 < (hullB->m_uniqueEdges).m_size) {
            pbVar4 = (local_1a0->m_uniqueEdges).m_data;
            fVar29 = pbVar4[lVar15].m_floats[0];
            fVar23 = pbVar4[lVar15].m_floats[1];
            fVar22 = pbVar4[lVar15].m_floats[2];
            fVar21 = (transA->m_basis).m_el[0].m_floats[2] * fVar22 +
                     (transA->m_basis).m_el[0].m_floats[0] * fVar29 +
                     (transA->m_basis).m_el[0].m_floats[1] * fVar23;
            fVar25 = fVar22 * (transA->m_basis).m_el[1].m_floats[2] +
                     fVar29 * (transA->m_basis).m_el[1].m_floats[0] +
                     (transA->m_basis).m_el[1].m_floats[1] * fVar23;
            fVar29 = fVar22 * (transA->m_basis).m_el[2].m_floats[2] +
                     fVar29 * (transA->m_basis).m_el[2].m_floats[0] +
                     (transA->m_basis).m_el[2].m_floats[1] * fVar23;
            local_158 = -fVar25;
            lVar17 = 8;
            lVar14 = 0;
            do {
              pbVar4 = (hullB->m_uniqueEdges).m_data;
              fVar23 = *(float *)((long)pbVar4->m_floats + lVar17 + -8);
              fVar22 = *(float *)((long)pbVar4->m_floats + lVar17 + -4);
              fVar24 = *(float *)((long)pbVar4->m_floats + lVar17);
              fVar26 = fVar24 * (transB->m_basis).m_el[0].m_floats[2] +
                       fVar23 * (transB->m_basis).m_el[0].m_floats[0] +
                       (transB->m_basis).m_el[0].m_floats[1] * fVar22;
              fVar27 = fVar24 * (transB->m_basis).m_el[1].m_floats[2] +
                       fVar23 * (transB->m_basis).m_el[1].m_floats[0] +
                       (transB->m_basis).m_el[1].m_floats[1] * fVar22;
              fVar30 = fVar24 * (transB->m_basis).m_el[2].m_floats[2] +
                       fVar23 * (transB->m_basis).m_el[2].m_floats[0] +
                       fVar22 * (transB->m_basis).m_el[2].m_floats[1];
              fVar23 = fVar30 * fVar25 + fVar27 * -fVar29;
              fVar22 = fVar26 * fVar29 + fVar30 * -fVar21;
              fVar24 = fVar27 * fVar21 + fVar26 * local_158;
              local_1b8.m_floats[1] = fVar22;
              local_1b8.m_floats[0] = fVar23;
              local_1b8.m_floats[2] = fVar24;
              local_1b8.m_floats[3] = 0.0;
              if (((1e-06 < ABS(fVar23)) || (1e-06 < ABS(fVar22))) ||
                 (cVar11 = '\0', 1e-06 < ABS(fVar24))) {
                fVar23 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
                if (fVar23 < 0.0) {
                  fVar23 = sqrtf(fVar23);
                }
                else {
                  fVar23 = SQRT(fVar23);
                }
                bVar6.m_floats = local_1b8.m_floats;
                fVar23 = 1.0 / fVar23;
                fVar22 = fVar23 * local_1b8.m_floats[0];
                local_1b8.m_floats[1] = fVar23 * local_1b8.m_floats[1];
                local_1b8.m_floats[0] = fVar22;
                local_1b8.m_floats[2] = bVar6.m_floats[2];
                local_1b8.m_floats[2] = fVar23 * local_1b8.m_floats[2];
                local_1b8.m_floats[3] = bVar6.m_floats[3];
                if (bVar9 * local_1b8.m_floats[2] + bVar7 * fVar22 + local_1b8.m_floats[1] * bVar8 <
                    0.0) {
                  local_1b8.m_floats[2] = -local_1b8.m_floats[2];
                  local_1b8.m_floats._0_8_ =
                       CONCAT44(local_1b8.m_floats[1],fVar22) ^ 0x8000000080000000;
                }
                local_1b8.m_floats[0] = (btScalar)local_1b8.m_floats[0];
                local_1b8.m_floats[1] = (btScalar)local_1b8.m_floats[1];
                local_1b8.m_floats[2] = (btScalar)local_1b8.m_floats[2];
                gExpectedNbTests = gExpectedNbTests + 1;
                if (gUseInternalObject == true) {
                  bVar19 = TestInternalObjects(transA,transB,&DeltaC2,&local_1b8,local_1a0,hullB,
                                               local_1bc);
                  cVar11 = '\r';
                  if (!bVar19) goto LAB_001869f9;
                }
                gActualNbTests = gActualNbTests + 1;
                bVar19 = TestSepAxis(local_1a0,hullB,transA,transB,&local_1b8,&d,&wA,&wB);
                bVar6 = wA;
                if ((bVar19) && (d < local_1bc)) {
                  *(undefined8 *)sep->m_floats = local_1b8.m_floats._0_8_;
                  *(undefined8 *)(sep->m_floats + 2) = local_1b8.m_floats._8_8_;
                  local_a8[0] = wA.m_floats[0];
                  local_a8[1] = wA.m_floats[1];
                  wA.m_floats[2] = bVar6.m_floats[2];
                  local_c8[0] = wB.m_floats[0];
                  local_c8[1] = wB.m_floats[1];
                  local_f8 = CONCAT44(fVar27,fVar26);
                  local_78 = CONCAT44(fVar25,fVar21);
                  local_17c = (uint)lVar14;
                  local_178 = (uint)lVar15;
                  local_1bc = d;
                  local_e8 = fVar30;
                  fVar28 = wA.m_floats[2];
                  fVar20 = wB.m_floats[2];
                  local_88 = fVar29;
                }
                cVar11 = !bVar19;
                wA = bVar6;
              }
LAB_001869f9:
              if ((cVar11 != '\r') && (cVar11 != '\0')) goto LAB_00186a29;
              lVar14 = lVar14 + 1;
              lVar17 = lVar17 + 0x10;
            } while (lVar14 < (hullB->m_uniqueEdges).m_size);
            cVar11 = '\v';
          }
LAB_00186a29:
          if ((cVar11 != '\v') && (cVar11 != '\0')) break;
          lVar15 = lVar15 + 1;
          lVar14 = (long)(local_1a0->m_uniqueEdges).m_size;
          bVar18 = lVar14 <= lVar15;
        } while (lVar15 < lVar14);
        bVar19 = -1 < (int)(local_178 | local_17c);
      }
      if (bVar18 == false) {
        return false;
      }
      if (bVar19) {
        local_a8[0] = local_c8[0] - local_a8[0];
        local_a8[1] = local_c8[1] - local_a8[1];
        fVar28 = fVar20 - fVar28;
        fVar29 = local_88 * local_e8 +
                 (float)local_78 * (float)local_f8 + local_f8._4_4_ * local_78._4_4_;
        fVar23 = local_88 * fVar28 + (float)local_78 * local_a8[0] + local_78._4_4_ * local_a8[1];
        fVar25 = local_e8 * fVar28 + (float)local_f8 * local_a8[0] + local_f8._4_4_ * local_a8[1];
        fVar22 = 1.0 - fVar29 * fVar29;
        if ((fVar22 != 0.0) || (fVar21 = 0.0, NAN(fVar22))) {
          fVar22 = (fVar23 - fVar25 * fVar29) / fVar22;
          fVar21 = -1e+30;
          if ((-1e+30 <= fVar22) && (fVar21 = fVar22, 1e+30 < fVar22)) {
            fVar21 = 1e+30;
          }
        }
        fVar25 = fVar21 * fVar29 - fVar25;
        if (-1e+30 <= fVar25) {
          if (1e+30 < fVar25) {
            fVar25 = 1e+30;
            fVar23 = fVar29 * 1e+30 + fVar23;
            fVar21 = -1e+30;
            if ((-1e+30 <= fVar23) && (fVar25 = 1e+30, fVar21 = fVar23, 1e+30 < fVar23)) {
              fVar21 = 1e+30;
              fVar25 = 1e+30;
            }
          }
        }
        else {
          fVar25 = -1e+30;
          fVar21 = fVar29 * -1e+30 + fVar23;
          if (-1e+30 <= fVar21) {
            if (1e+30 < fVar21) {
              fVar21 = 1e+30;
            }
          }
          else {
            fVar21 = -1e+30;
          }
        }
        fVar29 = (local_a8[0] - (float)local_78 * fVar21) + (float)local_f8 * fVar25;
        fVar23 = (local_a8[1] - local_78._4_4_ * fVar21) + local_f8._4_4_ * fVar25;
        fVar28 = (fVar28 - local_88 * fVar21) + local_e8 * fVar25;
        local_1b8.m_floats[1] = fVar23;
        local_1b8.m_floats[0] = fVar29;
        local_1b8.m_floats[2] = fVar28;
        local_1b8.m_floats[3] = 0.0;
        fVar28 = fVar28 * fVar28 + fVar29 * fVar29 + fVar23 * fVar23;
        if (1.1920929e-07 < fVar28) {
          if (fVar28 < 0.0) {
            fVar28 = sqrtf(fVar28);
          }
          else {
            fVar28 = SQRT(fVar28);
          }
          bVar6.m_floats = local_1b8.m_floats;
          fVar23 = 1.0 / fVar28;
          fVar29 = fVar23 * local_1b8.m_floats[0];
          local_1b8.m_floats[1] = fVar23 * local_1b8.m_floats[1];
          local_1b8.m_floats[0] = fVar29;
          local_1b8.m_floats[2] = bVar6.m_floats[2];
          local_1b8.m_floats[2] = fVar23 * local_1b8.m_floats[2];
          local_1b8.m_floats[3] = bVar6.m_floats[3];
          if (DeltaC2.m_floats[2] * local_1b8.m_floats[2] +
              DeltaC2.m_floats[0] * fVar29 + local_1b8.m_floats[1] * DeltaC2.m_floats[1] < 0.0) {
            local_1b8.m_floats[2] = -local_1b8.m_floats[2];
            local_1b8.m_floats._0_8_ = CONCAT44(local_1b8.m_floats[1],fVar29) ^ 0x8000000080000000;
          }
          local_1b8.m_floats[0] = (btScalar)local_1b8.m_floats[0];
          local_1b8.m_floats[1] = (btScalar)local_1b8.m_floats[1];
          local_1b8.m_floats[2] = (btScalar)local_1b8.m_floats[2];
          wA.m_floats[1] = local_c8[1] + local_f8._4_4_ * fVar25;
          wA.m_floats[0] = local_c8[0] + (float)local_f8 * fVar25;
          wA.m_floats[2] = fVar20 + local_e8 * fVar25;
          wA.m_floats[3] = 0.0;
          (*resultOut->_vptr_Result[4])(-fVar28,resultOut,&local_1b8);
        }
      }
      uVar13 = *(ulong *)sep->m_floats;
      if (0.0 <= DeltaC2.m_floats[2] * sep->m_floats[2] +
                 DeltaC2.m_floats[0] * (float)uVar13 + (float)(uVar13 >> 0x20) * DeltaC2.m_floats[1]
         ) {
        return bVar18;
      }
      auVar5._8_4_ = -sep->m_floats[2];
      auVar5._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar5._12_4_ = 0;
      *(undefined1 (*) [16])sep->m_floats = auVar5;
      return bVar18;
    }
  }
  return false;
}

Assistant:

bool btPolyhedralContactClipping::findSeparatingAxis(	const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, btVector3& sep, btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

//#ifdef TEST_INTERNAL_OBJECTS
	const btVector3 c0 = transA * hullA.m_localCenter;
	const btVector3 c1 = transB * hullB.m_localCenter;
	const btVector3 DeltaC2 = c0 - c1;
//#endif

	btScalar dmin = FLT_MAX;
	int curPlaneTests=0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for(int i=0;i<numFacesA;i++)
	{
		const btVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		btVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS)<0)
			faceANormalWS*=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis( hullA, hullB, transA,transB, faceANormalWS, d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for(int i=0;i<numFacesB;i++)
	{
		const btVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		btVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal)<0)
			WorldNormal *=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis(hullA, hullB,transA,transB, WorldNormal,d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	btVector3 edgeAstart,edgeAend,edgeBstart,edgeBend;
	int edgeA=-1;
	int edgeB=-1;
	btVector3 worldEdgeA;
	btVector3 worldEdgeB;
	btVector3 witnessPointA(0,0,0),witnessPointB(0,0,0);
	

	int curEdgeEdge = 0;
	// Test edges
	for(int e0=0;e0<hullA.m_uniqueEdges.size();e0++)
	{
		const btVector3 edge0 = hullA.m_uniqueEdges[e0];
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		for(int e1=0;e1<hullB.m_uniqueEdges.size();e1++)
		{
			const btVector3 edge1 = hullB.m_uniqueEdges[e1];
			const btVector3 WorldEdge1 = transB.getBasis() * edge1;

			btVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if(!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross)<0)
					Cross *= -1.f;


#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				btScalar dist;
				btVector3 wA,wB;
				if(!TestSepAxis( hullA, hullB, transA,transB, Cross, dist,wA,wB))
					return false;

				if(dist<dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA=e0;
					edgeB=e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA=wA;
					witnessPointB=wB;
				}
			}
		}

	}

	if (edgeA>=0&&edgeB>=0)
	{
//		printf("edge-edge\n");
		//add an edge-edge contact

		btVector3 ptsVector;
		btVector3 offsetA;
		btVector3 offsetB;
		btScalar tA;
		btScalar tB;

		btVector3 translation = witnessPointB-witnessPointA;

		btVector3 dirA = worldEdgeA;
		btVector3 dirB = worldEdgeB;
		
		btScalar hlenB = 1e30f;
		btScalar hlenA = 1e30f;

		btSegmentsClosestPoints(ptsVector,offsetA,offsetB,tA,tB,
			translation,
			dirA, hlenA,
			dirB,hlenB);

		btScalar nlSqrt = ptsVector.length2();
		if (nlSqrt>SIMD_EPSILON)
		{
			btScalar nl = btSqrt(nlSqrt);
			ptsVector *= 1.f/nl;
			if (ptsVector.dot(DeltaC2)<0.f)
			{
				ptsVector*=-1.f;
			}
			btVector3 ptOnB = witnessPointB + offsetB;
			btScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB,-distance);
		}

	}


	if((DeltaC2.dot(sep))<0.0f)
		sep = -sep;

	return true;
}